

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_symbol(nk_command_buffer *out,nk_symbol_type type,nk_rect content,nk_color background,
                   nk_color foreground,float border_width,nk_user_font *font)

{
  nk_rect nVar1;
  float local_c8;
  float local_c4;
  char *local_b0;
  char *local_a8;
  nk_vec2 local_98;
  nk_vec2 points [3];
  nk_heading heading;
  undefined1 local_50 [8];
  nk_text text;
  char *X;
  nk_user_font *font_local;
  float border_width_local;
  nk_symbol_type type_local;
  nk_command_buffer *out_local;
  nk_color foreground_local;
  nk_color background_local;
  nk_rect content_local;
  
  switch(type) {
  default:
    break;
  case NK_SYMBOL_X:
  case NK_SYMBOL_UNDERSCORE:
  case NK_SYMBOL_PLUS:
  case NK_SYMBOL_MINUS:
    if (type == NK_SYMBOL_X) {
      local_a8 = "x";
    }
    else {
      if (type == NK_SYMBOL_UNDERSCORE) {
        local_b0 = "_";
      }
      else {
        local_b0 = "-";
        if (type == NK_SYMBOL_PLUS) {
          local_b0 = "+";
        }
      }
      local_a8 = local_b0;
    }
    text._8_8_ = local_a8;
    local_50 = (undefined1  [8])nk_vec2(0.0,0.0);
    text.padding.x = (float)background;
    text.padding.y = (float)foreground;
    nk_widget_text(out,content,(char *)text._8_8_,1,(nk_text *)local_50,0x12,font);
    break;
  case NK_SYMBOL_CIRCLE_SOLID:
  case NK_SYMBOL_CIRCLE_OUTLINE:
  case NK_SYMBOL_RECT_SOLID:
  case NK_SYMBOL_RECT_OUTLINE:
    if ((type == NK_SYMBOL_RECT_SOLID) || (type == NK_SYMBOL_RECT_OUTLINE)) {
      nk_fill_rect(out,content,0.0,foreground);
      if (type == NK_SYMBOL_RECT_OUTLINE) {
        nVar1 = nk_shrink_rect(content,border_width);
        nk_fill_rect(out,nVar1,0.0,background);
      }
    }
    else {
      nk_fill_circle(out,content,foreground);
      if (type == NK_SYMBOL_CIRCLE_OUTLINE) {
        nVar1 = nk_shrink_rect(content,1.0);
        nk_fill_circle(out,nVar1,background);
      }
    }
    break;
  case NK_SYMBOL_TRIANGLE_UP:
  case NK_SYMBOL_TRIANGLE_DOWN:
  case NK_SYMBOL_TRIANGLE_LEFT:
  case NK_SYMBOL_TRIANGLE_RIGHT:
    if (type == NK_SYMBOL_TRIANGLE_RIGHT) {
      local_c4 = 1.4013e-45;
    }
    else {
      if (type == NK_SYMBOL_TRIANGLE_LEFT) {
        local_c8 = 4.2039e-45;
      }
      else {
        local_c8 = 2.8026e-45;
        if (type == NK_SYMBOL_TRIANGLE_UP) {
          local_c8 = 0.0;
        }
      }
      local_c4 = local_c8;
    }
    points[2].y = local_c4;
    nk_triangle_from_direction(&local_98,content,0.0,0.0,(nk_heading)local_c4);
    nk_fill_triangle(out,local_98.x,local_98.y,points[0].x,points[0].y,points[1].x,points[1].y,
                     foreground);
  }
  return;
}

Assistant:

NK_LIB void
nk_draw_symbol(struct nk_command_buffer *out, enum nk_symbol_type type,
    struct nk_rect content, struct nk_color background, struct nk_color foreground,
    float border_width, const struct nk_user_font *font)
{
    switch (type) {
    case NK_SYMBOL_X:
    case NK_SYMBOL_UNDERSCORE:
    case NK_SYMBOL_PLUS:
    case NK_SYMBOL_MINUS: {
        /* single character text symbol */
        const char *X = (type == NK_SYMBOL_X) ? "x":
            (type == NK_SYMBOL_UNDERSCORE) ? "_":
            (type == NK_SYMBOL_PLUS) ? "+": "-";
        struct nk_text text;
        text.padding = nk_vec2(0,0);
        text.background = background;
        text.text = foreground;
        nk_widget_text(out, content, X, 1, &text, NK_TEXT_CENTERED, font);
    } break;
    case NK_SYMBOL_CIRCLE_SOLID:
    case NK_SYMBOL_CIRCLE_OUTLINE:
    case NK_SYMBOL_RECT_SOLID:
    case NK_SYMBOL_RECT_OUTLINE: {
        /* simple empty/filled shapes */
        if (type == NK_SYMBOL_RECT_SOLID || type == NK_SYMBOL_RECT_OUTLINE) {
            nk_fill_rect(out, content,  0, foreground);
            if (type == NK_SYMBOL_RECT_OUTLINE)
                nk_fill_rect(out, nk_shrink_rect(content, border_width), 0, background);
        } else {
            nk_fill_circle(out, content, foreground);
            if (type == NK_SYMBOL_CIRCLE_OUTLINE)
                nk_fill_circle(out, nk_shrink_rect(content, 1), background);
        }
    } break;
    case NK_SYMBOL_TRIANGLE_UP:
    case NK_SYMBOL_TRIANGLE_DOWN:
    case NK_SYMBOL_TRIANGLE_LEFT:
    case NK_SYMBOL_TRIANGLE_RIGHT: {
        enum nk_heading heading;
        struct nk_vec2 points[3];
        heading = (type == NK_SYMBOL_TRIANGLE_RIGHT) ? NK_RIGHT :
            (type == NK_SYMBOL_TRIANGLE_LEFT) ? NK_LEFT:
            (type == NK_SYMBOL_TRIANGLE_UP) ? NK_UP: NK_DOWN;
        nk_triangle_from_direction(points, content, 0, 0, heading);
        nk_fill_triangle(out, points[0].x, points[0].y, points[1].x, points[1].y,
            points[2].x, points[2].y, foreground);
    } break;
    default:
    case NK_SYMBOL_NONE:
    case NK_SYMBOL_MAX: break;
    }
}